

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlHaltParser(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  uint uVar2;
  xmlParserInputPtr *ppxVar3;
  xmlParserInputPtr pxVar4;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    uVar2 = ctxt->inputNr;
    while (1 < (int)uVar2) {
      uVar1 = uVar2 - 1;
      ctxt->inputNr = uVar1;
      ppxVar3 = ctxt->inputTab;
      ctxt->input = ppxVar3[(ulong)uVar2 - 2];
      pxVar4 = ppxVar3[uVar1];
      ppxVar3[uVar1] = (xmlParserInputPtr)0x0;
      xmlFreeInputStream(pxVar4);
      uVar2 = ctxt->inputNr;
    }
    pxVar4 = ctxt->input;
    if (pxVar4 != (xmlParserInputPtr)0x0) {
      if (pxVar4->free != (xmlParserInputDeallocate)0x0) {
        (*pxVar4->free)(pxVar4->base);
        pxVar4 = ctxt->input;
        pxVar4->free = (xmlParserInputDeallocate)0x0;
      }
      if (pxVar4->buf != (xmlParserInputBufferPtr)0x0) {
        xmlFreeParserInputBuffer(pxVar4->buf);
        pxVar4 = ctxt->input;
        pxVar4->buf = (xmlParserInputBufferPtr)0x0;
      }
      pxVar4->cur = "";
      pxVar4->length = 0;
      pxVar4->base = "";
      pxVar4->end = "";
    }
  }
  return;
}

Assistant:

static void
xmlHaltParser(xmlParserCtxtPtr ctxt) {
    if (ctxt == NULL)
        return;
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    while (ctxt->inputNr > 1)
        xmlFreeInputStream(inputPop(ctxt));
    if (ctxt->input != NULL) {
        /*
	 * in case there was a specific allocation deallocate before
	 * overriding base
	 */
        if (ctxt->input->free != NULL) {
	    ctxt->input->free((xmlChar *) ctxt->input->base);
	    ctxt->input->free = NULL;
	}
        if (ctxt->input->buf != NULL) {
            xmlFreeParserInputBuffer(ctxt->input->buf);
            ctxt->input->buf = NULL;
        }
	ctxt->input->cur = BAD_CAST"";
        ctxt->input->length = 0;
	ctxt->input->base = ctxt->input->cur;
        ctxt->input->end = ctxt->input->cur;
    }
}